

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O3

int Vec_MemHashInsert(Vec_Mem_t *p,word *pEntry)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int *piVar4;
  word **ppwVar5;
  word *pwVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar13;
  byte local_44;
  ulong uVar12;
  
  pVVar2 = p->vTable;
  if (pVVar2->nSize < p->nEntries) {
    uVar13 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar11 = (uint)uVar13;
        uVar10 = uVar11 + 1;
        uVar12 = (ulong)uVar10;
        uVar1 = uVar13 & 1;
        uVar13 = uVar12;
      } while (uVar1 != 0);
      if (uVar10 < 9) break;
      iVar7 = 5;
      while (uVar10 % (iVar7 - 2U) != 0) {
        uVar3 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar10 < uVar3) goto LAB_007081b4;
      }
    }
LAB_007081b4:
    if (pVVar2->nCap < (int)uVar10) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar10 << 2);
      }
      else {
        piVar4 = (int *)realloc(pVVar2->pArray,(long)(int)uVar10 << 2);
      }
      pVVar2->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar10;
    }
    if (uVar11 < 0x7fffffff) {
      memset(pVVar2->pArray,0xff,uVar12 << 2);
    }
    pVVar2->nSize = uVar10;
    p->vNexts->nSize = 0;
    iVar7 = p->nEntries;
    if (iVar7 < 1) {
      iVar8 = 0;
    }
    else {
      pwVar6 = *p->ppPages;
      if (pwVar6 == (word *)0x0) goto LAB_007083f6;
      uVar11 = 0;
      do {
        piVar4 = Vec_MemHashLookup(p,pwVar6 + (long)p->nEntrySize *
                                              (long)(int)(p->PageMask & uVar11));
        if (*piVar4 != -1) {
          __assert_fail("*pSpot == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                        ,0x161,"void Vec_MemHashResize(Vec_Mem_t *)");
        }
        pVVar2 = p->vNexts;
        *piVar4 = pVVar2->nSize;
        Vec_IntPush(pVVar2,-1);
        uVar11 = uVar11 + 1;
        iVar7 = p->nEntries;
      } while (((int)uVar11 < iVar7) &&
              (pwVar6 = p->ppPages[uVar11 >> ((byte)p->LogPageSze & 0x1f)], pwVar6 != (word *)0x0));
      iVar8 = p->vNexts->nSize;
    }
    if (iVar7 != iVar8) {
LAB_007083f6:
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0x165,"void Vec_MemHashResize(Vec_Mem_t *)");
    }
  }
  piVar4 = Vec_MemHashLookup(p,pEntry);
  iVar7 = *piVar4;
  if (iVar7 == -1) {
    pVVar2 = p->vNexts;
    *piVar4 = pVVar2->nSize;
    Vec_IntPush(pVVar2,-1);
    uVar11 = p->nEntries;
    if ((int)uVar11 < 0) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
    }
    iVar7 = p->iPage;
    local_44 = (byte)p->LogPageSze;
    uVar10 = uVar11 >> (local_44 & 0x1f);
    if (iVar7 < (int)uVar10) {
      iVar8 = p->nPageAlloc;
      if (iVar8 <= (int)uVar10) {
        iVar9 = uVar10 + 0x20;
        if (iVar8 != 0) {
          iVar9 = iVar8 * 2;
        }
        p->nPageAlloc = iVar9;
        if (p->ppPages == (word **)0x0) {
          ppwVar5 = (word **)malloc((long)iVar9 * 8);
        }
        else {
          ppwVar5 = (word **)realloc(p->ppPages,(long)iVar9 * 8);
          local_44 = (byte)p->LogPageSze;
          iVar7 = p->iPage;
        }
        p->ppPages = ppwVar5;
      }
      if (iVar7 < (int)uVar10) {
        iVar8 = p->nEntrySize;
        uVar13 = (long)iVar7;
        do {
          uVar1 = uVar13 + 1;
          pwVar6 = (word *)malloc((long)(iVar8 << (local_44 & 0x1f)) << 3);
          p->ppPages[uVar13 + 1] = pwVar6;
          uVar13 = uVar1;
        } while (uVar10 != uVar1);
      }
      p->iPage = uVar10;
      uVar10 = uVar11 >> (local_44 & 0x1f);
    }
    p->nEntries = uVar11 + 1;
    memmove(p->ppPages[uVar10] + (long)(int)(p->PageMask & uVar11) * (long)p->nEntrySize,pEntry,
            (long)p->nEntrySize << 3);
    if (p->nEntries != p->vNexts->nSize) {
      __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0x172,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
    }
    iVar7 = p->nEntries + -1;
  }
  return iVar7;
}

Assistant:

static int Vec_MemHashInsert( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot;
    if ( p->nEntries > Vec_IntSize(p->vTable) )
        Vec_MemHashResize( p );
    pSpot = Vec_MemHashLookup( p, pEntry );
    if ( *pSpot != -1 )
        return *pSpot;
    *pSpot = Vec_IntSize(p->vNexts);
    Vec_IntPush( p->vNexts, -1 );
    Vec_MemPush( p, pEntry );
    assert( p->nEntries == Vec_IntSize(p->vNexts) );
    return Vec_IntSize(p->vNexts) - 1;
}